

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

char * Kit_DsdWriteHex(char *pBuff,uint *pTruth,int nFans)

{
  char cVar1;
  uint uVar2;
  int local_28;
  int k;
  int Digit;
  int nDigits;
  int nFans_local;
  uint *pTruth_local;
  char *pBuff_local;
  
  local_28 = (1 << ((byte)nFans & 0x1f)) / 4;
  pTruth_local = (uint *)pBuff;
  while (local_28 = local_28 + -1, -1 < local_28) {
    uVar2 = pTruth[local_28 / 8] >> ((byte)(local_28 % 8 << 2) & 0x1f) & 0xf;
    cVar1 = (char)uVar2;
    if (uVar2 < 10) {
      *(char *)pTruth_local = cVar1 + '0';
    }
    else {
      *(char *)pTruth_local = cVar1 + '7';
    }
    pTruth_local = (uint *)((long)pTruth_local + 1);
  }
  return (char *)pTruth_local;
}

Assistant:

char * Kit_DsdWriteHex( char * pBuff, unsigned * pTruth, int nFans )
{
    int nDigits, Digit, k;
    nDigits = (1 << nFans) / 4;
    for ( k = nDigits - 1; k >= 0; k-- )
    {
        Digit = ((pTruth[k/8] >> ((k%8) * 4)) & 15);
        if ( Digit < 10 )
            *pBuff++ = '0' + Digit;
        else
            *pBuff++ = 'A' + Digit-10;
    }
    return pBuff;
}